

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_error.cpp
# Opt level: O2

void skiwi::throw_error(error_type t,string *extra)

{
  undefined8 extraout_RAX;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_51);
  std::__cxx11::string::string((string *)&local_50,(string *)extra);
  throw_error(-1,-1,&local_30,t,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void throw_error(error_type t, std::string extra)
  {
  throw_error(-1, -1, "", t, extra);
  }